

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

LY_ERR ly_vlog_build_path_line(ly_ctx *ctx,char **data_path,char **schema_path,uint64_t *line)

{
  uint64_t uVar1;
  LY_ERR LVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcStack_40;
  LY_ERR ret__;
  char *path;
  uint64_t *puStack_30;
  int r;
  uint64_t *line_local;
  char **schema_path_local;
  char **data_path_local;
  ly_ctx *ctx_local;
  
  *data_path = (char *)0x0;
  *schema_path = (char *)0x0;
  *line = 0;
  puStack_30 = line;
  line_local = (uint64_t *)schema_path;
  schema_path_local = data_path;
  data_path_local = (char **)ctx;
  lVar3 = __tls_get_addr(&PTR_00277fa0);
  if (*(int *)(lVar3 + 0x24) == 0) {
    lVar3 = __tls_get_addr(&PTR_00277fa0);
    if (*(int *)(lVar3 + 0x14) != 0) {
      lVar3 = __tls_get_addr(&PTR_00277fa0);
      lVar3 = *(long *)(lVar3 + 0x18);
      lVar5 = __tls_get_addr(&PTR_00277fa0);
      pcVar4 = lysc_path(*(lysc_node **)(lVar3 + (ulong)(*(int *)(lVar5 + 0x14) - 1) * 8),
                         LYSC_PATH_LOG,(char *)0x0,0);
      *line_local = (uint64_t)pcVar4;
      if (*line_local == 0) {
        ly_log((ly_ctx *)data_path_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "ly_vlog_build_path_line");
        return LY_EMEM;
      }
    }
  }
  else {
    LVar2 = ly_vlog_build_data_path((ly_ctx *)data_path_local,schema_path_local);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  lVar3 = __tls_get_addr(&PTR_00277fa0);
  if (*(int *)(lVar3 + 0x34) != 0) {
    lVar3 = __tls_get_addr(&PTR_00277fa0);
    lVar3 = *(long *)(lVar3 + 0x38);
    lVar5 = __tls_get_addr(&PTR_00277fa0);
    if (**(char **)(lVar3 + (ulong)(*(int *)(lVar5 + 0x34) - 1) * 8) != '\0') {
      if (*schema_path_local == (char *)0x0) {
        if (*line_local == 0) {
          lVar3 = __tls_get_addr(&PTR_00277fa0);
          lVar3 = *(long *)(lVar3 + 0x38);
          lVar5 = __tls_get_addr(&PTR_00277fa0);
          path._4_4_ = asprintf(&stack0xffffffffffffffc0,"%s",
                                *(undefined8 *)(lVar3 + (ulong)(*(int *)(lVar5 + 0x34) - 1) * 8));
        }
        else {
          uVar1 = *line_local;
          lVar3 = __tls_get_addr(&PTR_00277fa0);
          lVar3 = *(long *)(lVar3 + 0x38);
          lVar5 = __tls_get_addr(&PTR_00277fa0);
          path._4_4_ = asprintf(&stack0xffffffffffffffc0,"%s%s",uVar1,
                                *(undefined8 *)(lVar3 + (ulong)(*(int *)(lVar5 + 0x34) - 1) * 8));
        }
      }
      else {
        pcVar4 = *schema_path_local;
        lVar3 = __tls_get_addr(&PTR_00277fa0);
        lVar3 = *(long *)(lVar3 + 0x38);
        lVar5 = __tls_get_addr(&PTR_00277fa0);
        path._4_4_ = asprintf(&stack0xffffffffffffffc0,"%s%s",pcVar4,
                              *(undefined8 *)(lVar3 + (ulong)(*(int *)(lVar5 + 0x34) - 1) * 8));
      }
      if (path._4_4_ == -1) {
        ly_log((ly_ctx *)data_path_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "ly_vlog_build_path_line");
        return LY_EMEM;
      }
      if (*schema_path_local == (char *)0x0) {
        free((void *)*line_local);
        *line_local = (uint64_t)pcStack_40;
      }
      else {
        free(*schema_path_local);
        *schema_path_local = pcStack_40;
      }
    }
  }
  lVar3 = __tls_get_addr(&PTR_00277fa0);
  if (*(int *)(lVar3 + 4) != 0) {
    lVar3 = __tls_get_addr(&PTR_00277fa0);
    lVar3 = *(long *)(lVar3 + 8);
    lVar5 = __tls_get_addr(&PTR_00277fa0);
    *puStack_30 = *(uint64_t *)(*(long *)(lVar3 + (ulong)(*(int *)(lVar5 + 4) - 1) * 8) + 0x38);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ly_vlog_build_path_line(const struct ly_ctx *ctx, char **data_path, char **schema_path, uint64_t *line)
{
    int r;
    char *path;

    *data_path = NULL;
    *schema_path = NULL;
    *line = 0;

    /* data/schema node */
    if (log_location.dnodes.count) {
        LY_CHECK_RET(ly_vlog_build_data_path(ctx, data_path));
    } else if (log_location.scnodes.count) {
        *schema_path = lysc_path(log_location.scnodes.objs[log_location.scnodes.count - 1], LYSC_PATH_LOG, NULL, 0);
        LY_CHECK_ERR_RET(!*schema_path, LOGMEM(ctx), LY_EMEM);
    }

    if (log_location.paths.count && ((const char *)(log_location.paths.objs[log_location.paths.count - 1]))[0]) {
        /* append the provided path string to data/schema path, if any */
        if (*data_path) {
            r = asprintf(&path, "%s%s", *data_path, (char *)log_location.paths.objs[log_location.paths.count - 1]);
        } else if (*schema_path) {
            r = asprintf(&path, "%s%s", *schema_path, (char *)log_location.paths.objs[log_location.paths.count - 1]);
        } else {
            r = asprintf(&path, "%s", (char *)log_location.paths.objs[log_location.paths.count - 1]);
        }
        LY_CHECK_ERR_RET(r == -1, LOGMEM(ctx), LY_EMEM);

        if (*data_path) {
            free(*data_path);
            *data_path = path;
        } else {
            free(*schema_path);
            *schema_path = path;
        }
    }

    /* line */
    if (log_location.inputs.count) {
        *line = ((struct ly_in *)log_location.inputs.objs[log_location.inputs.count - 1])->line;
    }

    return LY_SUCCESS;
}